

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

string * __thiscall
util::str<char[41],char[100],char[2],int>
          (string *__return_storage_ptr__,util *this,char (*args) [41],char (*args_1) [100],
          char (*args_2) [2],int *args_3)

{
  ostringstream ss;
  ostringstream aoStack_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  detail::_str<char[41],char[100],char[2],int>
            ((ostream *)aoStack_1a8,(char (*) [41])this,(char (*) [100])args,(char (*) [2])args_1,
             (int *)args_2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string str(const Args&... args) {
  std::ostringstream ss;
  detail::_str(ss, args...);
  return ss.str();
}